

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesSelect
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  int iVar6;
  charcount_t cchUseLength;
  charcount_t cVar7;
  undefined4 *puVar8;
  Var pvVar9;
  DynamicObject *stateObject;
  Var pvVar10;
  FinalizableUPluralRules *pFVar11;
  void **resource;
  FinalizableICUObject<void_**,_&unum_close_70> *pFVar12;
  Recycler *pRVar13;
  char *pcVar14;
  Recycler *pRVar15;
  LPCSTR pCVar16;
  char16 *content;
  JavascriptString *pJVar17;
  char *error;
  uint uVar18;
  size_t sVar19;
  uint in_stack_00000010;
  undefined1 local_118 [8];
  char localeID [157];
  Var cachedUNumberFormat;
  undefined1 local_68 [8];
  Arguments args;
  int local_44;
  FinalizableICUObject<void_**,_&unum_close_70> *pFStack_40;
  UErrorCode status;
  int local_34 [2];
  UErrorCode status_1;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe2,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])callInfo;
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe2,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_68 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe2,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  if ((local_68._0_4_ & 0xffffff) == 3) {
    pvVar9 = Arguments::operator[]((Arguments *)local_68,1);
    bVar3 = DynamicObject::IsBaseDynamicObject(pvVar9);
    if (!bVar3) goto LAB_00b67344;
  }
  else {
LAB_00b67344:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe3,
                                "((args.Info.Count == 3 && DynamicObject::IsBaseDynamicObject(args[1])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  pvVar9 = Arguments::operator[]((Arguments *)local_68,1);
  stateObject = UnsafeVarTo<Js::DynamicObject>(pvVar9);
  pvVar9 = Arguments::operator[]((Arguments *)local_68,2);
  if (((ulong)pvVar9 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar9 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_68,2);
  if (((ulong)pvVar9 & 0xffff000000000000) == 0x1000000000000) {
    args.Values = (Type)(double)(int)pvVar10;
  }
  else {
    if ((ulong)pvVar10 >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xbed,"(JavascriptNumber::Is(args[2]))",
                                  "JavascriptNumber::Is(args[2])");
      if (!bVar3) goto LAB_00b6816c;
      *puVar8 = 0;
    }
    pvVar9 = Arguments::operator[]((Arguments *)local_68,2);
    if (pvVar9 < (Var)0x4000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar3) goto LAB_00b6816c;
      *puVar8 = 0;
    }
    args.Values = (Type)((ulong)pvVar9 ^ 0xfffc000000000000);
  }
  Output::Trace(IntlPhase,L"%S(): Calling PluralRules.prototype.select(%f)\n",
                "EntryIntl_PluralRulesSelect");
  local_44 = 0;
  pFVar11 = GetOrCreateCachedUPluralRules(stateObject,pSVar1);
  stack0xffffffffffffff88 = (FinalizableICUObject<void_**,_&unum_close_70> *)0x0;
  iVar4 = (*(stateObject->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (stateObject,stateObject,10,localeID + 0x98,0,pSVar1);
  pFVar12 = stack0xffffffffffffff88;
  if (iVar4 == 0) {
    memset((char (*) [157])local_118,0,0x9d);
    pJVar17 = AssertStringProperty(stateObject,(PropertyIds)0x20d);
    LangtagToLocaleID<157ul>(pJVar17,(char (*) [157])local_118);
    pRVar15 = pSVar1->recycler;
    resource = (void **)unum_open_70(1,0,0,(char (*) [157])local_118,0,&local_44);
    pFVar12 = FinalizableICUObject<void_**,_&unum_close_70>::New(pRVar15,resource);
    SetUNumberFormatDigitOptions(pFVar12->resource,stateObject);
    Output::Trace(IntlPhase,L"%S(): Caching UNumberFormat object (0x%x) with localeID %S\n",
                  "EntryIntl_PluralRulesSelect",pFVar12,(char (*) [157])local_118);
    (*(stateObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x19])(stateObject,10,pFVar12,0,0);
  }
  else {
    Output::Trace(IntlPhase,L"%S(): Using previously cached UNumberFormat (0x%x)\n",
                  "EntryIntl_PluralRulesSelect",stack0xffffffffffffff88);
  }
  pRVar15 = pSVar1->recycler;
  local_34[0] = 0;
  local_118 = (undefined1  [8])&char16_t::typeinfo;
  localeID[0] = '\0';
  localeID[1] = '\0';
  localeID[2] = '\0';
  localeID[3] = '\0';
  localeID[4] = '\0';
  localeID[5] = '\0';
  localeID[6] = '\0';
  localeID[7] = '\0';
  localeID[8] = '\b';
  localeID[9] = '\0';
  localeID[10] = '\0';
  localeID[0xb] = '\0';
  localeID[0xc] = '\0';
  localeID[0xd] = '\0';
  localeID[0xe] = '\0';
  localeID[0xf] = '\0';
  localeID._16_8_ = anon_var_dwarf_6708ef9;
  localeID[0x18] = 'Y';
  localeID[0x19] = '\x01';
  localeID[0x1a] = '\0';
  localeID[0x1b] = '\0';
  pRVar13 = Memory::Recycler::TrackAllocInfo(pRVar15,(TrackAllocData *)local_118);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  pcVar14 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (pRVar13,0x10);
  if (pcVar14 == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  iVar4 = unum_formatDouble_70(args.Values,pFVar12->resource,pcVar14,8,0,local_34);
  if (iVar4 < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  if ((local_34[0] == 0xf) || (local_34[0] == -0x7c)) {
    pFStack_40 = pFVar12;
    if (iVar4 < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar3) goto LAB_00b6816c;
      *puVar8 = 0;
    }
    uVar18 = iVar4 + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar18);
    local_34[0] = 0;
    local_118 = (undefined1  [8])&char16_t::typeinfo;
    localeID[0] = '\0';
    localeID[1] = '\0';
    localeID[2] = '\0';
    localeID[3] = '\0';
    localeID[4] = '\0';
    localeID[5] = '\0';
    localeID[6] = '\0';
    localeID[7] = '\0';
    localeID._16_8_ = anon_var_dwarf_6708ef9;
    localeID[0x18] = 'b';
    localeID[0x19] = '\x01';
    localeID[0x1a] = '\0';
    localeID[0x1b] = '\0';
    localeID._8_8_ = (long)(int)uVar18;
    pRVar15 = Memory::Recycler::TrackAllocInfo(pRVar15,(TrackAllocData *)local_118);
    if (iVar4 == -1) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar15,(TrackAllocData *)0x0);
      pcVar14 = &DAT_00000008;
      pFVar12 = pFStack_40;
    }
    else {
      sVar19 = 0xffffffffffffffff;
      if (-1 < (int)uVar18) {
        sVar19 = (long)(int)uVar18 * 2;
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00b6816c;
        *puVar8 = 0;
      }
      pcVar14 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar15,sVar19);
      pFVar12 = pFStack_40;
      if (pcVar14 == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00b6816c;
        *puVar8 = 0;
      }
    }
    iVar6 = unum_formatDouble_70(pFVar12->resource,pcVar14,uVar18,0,local_34);
    bVar3 = iVar6 != iVar4;
    iVar4 = iVar6;
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      goto joined_r0x00b67a5d;
    }
  }
  else if (7 < iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00b67a5d:
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  if (0 < local_34[0] || local_34[0] == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    pCVar16 = (LPCSTR)u_errorName_70(local_34[0]);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar16);
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  pFStack_40 = (FinalizableICUObject<void_**,_&unum_close_70> *)
               unum_parseDouble_70(pFVar12->resource,pcVar14,iVar4,0,&local_44);
  if (local_44 == 7) {
    Throw::OutOfMemory();
  }
  if (local_44 < 1 && local_44 != -0x7c) {
    if ((((((((double)args.Values <= 0.0) || ((double)args.Values < (double)pFStack_40)) ||
           ((double)pFStack_40 < 0.0)) &&
          (((0.0 <= (double)args.Values || ((double)pFStack_40 < (double)args.Values)) ||
           (0.0 < (double)pFStack_40)))) &&
         ((((double)args.Values != 0.0 || (NAN((double)args.Values))) ||
          (((double)pFStack_40 != 0.0 || (NAN((double)pFStack_40))))))) &&
        ((((double)args.Values <= 0.0 || ((double)args.Values < (double)pFStack_40)) ||
         ((double)pFStack_40 < 0.0)))) &&
       (((0.0 <= (double)args.Values || ((double)pFStack_40 < (double)args.Values)) ||
        (0.0 < (double)pFStack_40)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      error = 
      "((n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) || (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) || (n == 0.0 && nWithOptions == 0))"
      ;
      pcVar14 = 
      "(n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) || (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) || (n == 0.0 && nWithOptions == 0)"
      ;
      goto LAB_00b67bb0;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    pcVar14 = (char *)u_errorName_70(local_44);
    error = "(false)";
LAB_00b67bb0:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xc1d,error,pcVar14);
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  pRVar15 = pSVar1->recycler;
  local_34[0] = 0;
  local_118 = (undefined1  [8])&char16_t::typeinfo;
  localeID[0] = '\0';
  localeID[1] = '\0';
  localeID[2] = '\0';
  localeID[3] = '\0';
  localeID[4] = '\0';
  localeID[5] = '\0';
  localeID[6] = '\0';
  localeID[7] = '\0';
  localeID[8] = '\b';
  localeID[9] = '\0';
  localeID[10] = '\0';
  localeID[0xb] = '\0';
  localeID[0xc] = '\0';
  localeID[0xd] = '\0';
  localeID[0xe] = '\0';
  localeID[0xf] = '\0';
  localeID._16_8_ = anon_var_dwarf_6708ef9;
  localeID[0x18] = 'Y';
  localeID[0x19] = '\x01';
  localeID[0x1a] = '\0';
  localeID[0x1b] = '\0';
  pRVar13 = Memory::Recycler::TrackAllocInfo(pRVar15,(TrackAllocData *)local_118);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  content = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (pRVar13,0x10);
  if (content == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  cchUseLength = uplrules_select_70(pFStack_40,pFVar11->resource,content,8,local_34);
  if ((int)cchUseLength < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x15b,
                                "(allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0)",
                                "allowZeroLengthStrings ? *returnLength >= 0 : *returnLength > 0");
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  if ((local_34[0] == 0xf) || (local_34[0] == -0x7c)) {
    if ((int)cchUseLength < 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x15e,"(*returnLength >= firstTryLength)",
                                  "Executor reported buffer failure but did not require additional space"
                                 );
      if (!bVar3) goto LAB_00b6816c;
      *puVar8 = 0;
    }
    uVar18 = cchUseLength + 1;
    Output::Trace(IntlPhase,
                  L"%S(): Buffer of length %d was too short, retrying with buffer of length %d\n",
                  "EnsureBuffer",8,(ulong)uVar18);
    local_34[0] = 0;
    local_118 = (undefined1  [8])&char16_t::typeinfo;
    localeID[0] = '\0';
    localeID[1] = '\0';
    localeID[2] = '\0';
    localeID[3] = '\0';
    localeID[4] = '\0';
    localeID[5] = '\0';
    localeID[6] = '\0';
    localeID[7] = '\0';
    localeID._16_8_ = anon_var_dwarf_6708ef9;
    localeID[0x18] = 'b';
    localeID[0x19] = '\x01';
    localeID[0x1a] = '\0';
    localeID[0x1b] = '\0';
    localeID._8_8_ = (long)(int)uVar18;
    pRVar15 = Memory::Recycler::TrackAllocInfo(pRVar15,(TrackAllocData *)local_118);
    if (cchUseLength == 0xffffffff) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar15,(TrackAllocData *)0x0);
      content = (char16 *)&DAT_00000008;
    }
    else {
      sVar19 = 0xffffffffffffffff;
      if (-1 < (int)uVar18) {
        sVar19 = (long)(int)uVar18 * 2;
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00b6816c;
        *puVar8 = 0;
      }
      content = (char16 *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                          (pRVar15,sVar19);
      if (content == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00b6816c;
        *puVar8 = 0;
      }
    }
    cVar7 = uplrules_select_70(pFStack_40,pFVar11->resource,content,uVar18,local_34);
    bVar3 = cVar7 != cchUseLength;
    cchUseLength = cVar7;
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x164,"(*returnLength == secondTryLength - 1)",
                                  "Second try of executor returned unexpected length");
      goto joined_r0x00b68087;
    }
  }
  else if (7 < (int)cchUseLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x168,"(*returnLength < firstTryLength)",
                                "Executor required additional length but reported successful status"
                               );
joined_r0x00b68087:
    if (!bVar3) goto LAB_00b6816c;
    *puVar8 = 0;
  }
  if (0 < local_34[0] || local_34[0] == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    pCVar16 = (LPCSTR)u_errorName_70(local_34[0]);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x16b,
                                "(!(U_FAILURE(status) || status == U_STRING_NOT_TERMINATED_WARNING))"
                                ,pCVar16);
    if (!bVar3) {
LAB_00b6816c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pJVar17 = JavascriptString::NewWithBuffer(content,cchUseLength,pSVar1);
  return pJVar17;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesSelect(RecyclableObject *function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 3 && DynamicObject::IsBaseDynamicObject(args[1]));

        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[1]);
        double n = 0.0;
        if (TaggedInt::Is(args[2]))
        {
            n = TaggedInt::ToDouble(args[2]);
        }
        else
        {
            AssertOrFailFast(JavascriptNumber::Is(args[2]));
            n = JavascriptNumber::GetValue(args[2]);
        }

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(PluralRules_Prototype_select);
        INTL_TRACE("Calling PluralRules.prototype.select(%f)", n);

        UErrorCode status = U_ZERO_ERROR;

        FinalizableUPluralRules *pr = GetOrCreateCachedUPluralRules(state, scriptContext);

        // ICU has an internal API, uplrules_selectWithFormat, that is equivalent to uplrules_select but will respect digit options of the passed UNumberFormat.
        // Since its an internal API, we can't use it -- however, we can work around it by creating a UNumberFormat with provided digit options,
        // formatting the requested number to a string, and then converting the string back to a double which we can pass to uplrules_select.
        // This workaround was suggested during the May 2018 ECMA-402 discussion.
        // The below is similar to GetOrCreateCachedUPluralRules, but since creating a UNumberFormat for Intl.NumberFormat is much more involved and no one else
        // uses this functionality, it makes more sense to me to just put the logic inline.
        Var cachedUNumberFormat = nullptr;
        FinalizableUNumberFormat *nf = nullptr;
        if (state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, nullptr, scriptContext))
        {
            nf = reinterpret_cast<FinalizableUNumberFormat *>(cachedUNumberFormat);
            INTL_TRACE("Using previously cached UNumberFormat (0x%x)", nf);
        }
        else
        {
            char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
            LangtagToLocaleID(AssertStringProperty(state, PropertyIds::locale), localeID);
            nf = FinalizableUNumberFormat::New(scriptContext->GetRecycler(), unum_open(UNUM_DECIMAL, nullptr, 0, localeID, nullptr, &status));

            SetUNumberFormatDigitOptions(*nf, state);

            INTL_TRACE("Caching UNumberFormat object (0x%x) with localeID %S", nf, localeID);

            state->SetInternalProperty(InternalPropertyIds::CachedUNumberFormat, nf, PropertyOperationFlags::PropertyOperation_None, nullptr);
        }

        char16 *formattedN = nullptr;
        int formattedNLength = 0;
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDouble(*nf, n, buf, bufLen, nullptr, status);
        }, scriptContext->GetRecycler(), &formattedN, &formattedNLength);

        double nWithOptions = unum_parseDouble(*nf, reinterpret_cast<UChar *>(formattedN), formattedNLength, nullptr, &status);

        ICU_ASSERT(status, (n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) ||
            (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) ||
            (n == 0.0 && nWithOptions == 0));

        char16 *selected = nullptr;
        int selectedLength = 0;
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return uplrules_select(*pr, nWithOptions, buf, bufLen, status);
        }, scriptContext->GetRecycler(), &selected, &selectedLength);

        return JavascriptString::NewWithBuffer(selected, static_cast<charcount_t>(selectedLength), scriptContext);
#else
        AssertOrFailFastMsg(false, "Intl-WinGlob should not be using PluralRulesSelect");
        return nullptr;
#endif
    }